

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O2

bool __thiscall QCss::Parser::parseHexColor(Parser *this,QColor *col)

{
  Spec SVar1;
  long in_FS_OFFSET;
  QColor QVar2;
  QAnyStringView in_stack_ffffffffffffff88;
  QArrayDataPointer<char> local_60;
  QArrayDataPointer<char16_t> local_48;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lexem((QString *)&local_48,this);
  QVar2 = QColor::fromString(in_stack_ffffffffffffff88);
  *(long *)col = QVar2._0_8_;
  *(int *)((long)&col->ct + 4) = QVar2.ct._4_4_;
  (col->ct).argb.pad = QVar2.ct._8_2_;
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  SVar1 = col->cspec;
  if (SVar1 == Invalid) {
    local_48.d._0_4_ = 2;
    local_48.size._4_4_ = 0;
    local_48._4_8_ = 0;
    local_48._12_8_ = 0;
    local_30 = "default";
    lexem((QString *)&stack0xffffffffffffff88,this);
    QString::toLatin1_helper_inplace((QString *)&local_60);
    if (local_60.ptr == (char *)0x0) {
      local_60.ptr = (char *)&QByteArray::_empty;
    }
    QMessageLogger::warning
              ((char *)&local_48,"QCssParser::parseHexColor: Unknown color name \'%s\'",local_60.ptr
              );
    QArrayDataPointer<char>::~QArrayDataPointer(&local_60);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffff88);
  }
  else {
    skipSpace(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return SVar1 != Invalid;
  }
  __stack_chk_fail();
}

Assistant:

bool Parser::parseHexColor(QColor *col)
{
    *col = QColor::fromString(lexem());
    if (!col->isValid()) {
        qWarning("QCssParser::parseHexColor: Unknown color name '%s'",lexem().toLatin1().constData());
        return false;
    }
    skipSpace();
    return true;
}